

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamDecoder.cpp
# Opt level: O3

void scan_bitstream_amiga(TrackData *trackdata)

{
  uint uVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  BitBuffer *this;
  uint32_t *pdw;
  LogHelper *pLVar6;
  long lVar7;
  uint32_t *puVar8;
  value_type_conflict3 *__val;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  uint8_t sector_nr;
  uint32_t calcsum;
  uint32_t info;
  int sector_offset;
  uint32_t disksum;
  CRC16 crc;
  Data data;
  Track track;
  Sector sector;
  byte local_d1;
  uint32_t local_d0;
  uint32_t local_cc;
  int local_c8;
  int local_c4;
  TrackData *local_c0;
  DataRate local_b4;
  uint32_t local_b0;
  CRC16 local_aa;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  Track local_90;
  Sector local_70;
  
  local_c0 = trackdata;
  this = TrackData::bitstream(trackdata);
  BitBuffer::seek(this,0);
  Track::Track(&local_90,0);
  local_90.tracklen = BitBuffer::track_bitsize(this);
  CRC16::CRC16(&local_aa,0xffff);
  bVar11 = opt.a1sync == 0;
  uVar9 = 0;
  while( true ) {
    bVar2 = BitBuffer::wrapped(this);
    if ((bVar2) ||
       ((iVar4 = Track::size(&local_90), iVar4 == 0 &&
        (iVar4 = BitBuffer::tell(this), local_90.tracklen < iVar4)))) break;
    bVar3 = BitBuffer::read1(this);
    uVar9 = (uint)bVar3 | uVar9 * 2;
    if ((uVar9 & (-(uint)bVar11 | 0xffdfffdf)) == 0x44894489) {
      local_c8 = BitBuffer::tell(this);
      local_cc = 0;
      local_d0 = 0;
      bVar2 = amiga_read_dwords(this,&local_cc,1,&local_d0);
      if (bVar2) {
        local_d1 = (byte)(local_cc >> 0x10);
        if ((char)local_cc == -1) {
          uVar10 = 0xb;
          if (this->datarate == _500K) {
            uVar10 = 0x16;
          }
          if ((((local_cc >> 0x18 <= uVar10) && (0xffffff < local_cc)) &&
              ((local_cc >> 0x10 & 0xff) < uVar10)) &&
             (uVar10 = local_cc >> 8,
             (char)(local_cc >> 8) ==
             (char)((char)(local_c0->cylhead).cyl * '\x02' + (char)(local_c0->cylhead).head))) {
            pdw = (uint32_t *)operator_new(0x10);
            pdw[0] = 0;
            pdw[1] = 0;
            pdw[2] = 0;
            pdw[3] = 0;
            bVar2 = amiga_read_dwords(this,pdw,4,&local_d0);
            if (bVar2) {
              uVar5 = *pdw;
              lVar7 = 4;
              puVar8 = pdw;
              do {
                uVar1 = *(uint *)((long)pdw + lVar7);
                bVar2 = uVar5 < uVar1;
                if (uVar5 <= uVar1) {
                  uVar5 = uVar1;
                }
                if (bVar2) {
                  puVar8 = (uint32_t *)((long)pdw + lVar7);
                }
                lVar7 = lVar7 + 4;
              } while (lVar7 != 0x10);
              if (*puVar8 != 0) {
                local_70.header._0_8_ =
                     CHS((local_c0->cylhead).cyl,(local_c0->cylhead).head,uVar10 & 0xff);
                Message<char_const*>(msgWarning,"%s label field is not empty",(char **)&local_70);
              }
              bVar2 = amiga_read_dwords(this,&local_b0,1,&local_d0);
              if ((bVar2) && ((local_d0 = local_d0 & 0x55555555, local_d0 == 0 || (opt.idcrc != 0)))
                 ) {
                local_b4 = this->datarate;
                Header::Header((Header *)&local_a8,&local_c0->cylhead,(uint)local_d1,2);
                Sector::Sector(&local_70,local_b4,Amiga,(Header *)&local_a8,0);
                local_70.offset = BitBuffer::track_offset(this,local_c8);
                bVar2 = amiga_read_dwords(this,&local_b0,1,&local_d0);
                if (bVar2) {
                  iVar4 = Sector::size(&local_70);
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                            (&local_a8,(long)iVar4,(allocator_type *)&local_c4);
                  bVar2 = amiga_read_dwords(this,(uint32_t *)
                                                 local_a8.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start,
                                            (ulong)(long)((int)local_a8.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (int)local_a8.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2,
                                            &local_d0);
                  if (bVar2) {
                    if (opt.debug != 0) {
                      pLVar6 = util::operator<<((LogHelper *)&util::cout,
                                                (char (*) [15])"s_b_amiga (id=");
                      pLVar6 = util::operator<<(pLVar6,&local_d1);
                      pLVar6 = util::operator<<(pLVar6,(char (*) [13])") at offset ");
                      pLVar6 = util::operator<<(pLVar6,&local_c8);
                      pLVar6 = util::operator<<(pLVar6,(char (*) [3])0x1ae468);
                      local_c4 = BitBuffer::track_offset(this,local_c8);
                      pLVar6 = util::operator<<(pLVar6,&local_c4);
                      util::operator<<(pLVar6,(char (*) [3])0x1af6ac);
                    }
                    Sector::add(&local_70,(Data *)&local_a8,(local_d0 & 0x55555555) != 0,'\0');
                    Track::add(&local_90,&local_70);
                  }
                  if ((uint32_t *)
                      local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start != (uint32_t *)0x0) {
                    operator_delete(local_a8.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                    (long)local_a8.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_a8.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
                std::vector<Data,_std::allocator<Data>_>::~vector
                          ((vector<Data,_std::allocator<Data>_> *)((long)&local_70 + 0x28));
              }
            }
            operator_delete(pdw,0x10);
          }
        }
      }
    }
  }
  TrackData::add(local_c0,&local_90);
  std::vector<Sector,_std::allocator<Sector>_>::~vector(&local_90.m_sectors);
  return;
}

Assistant:

void scan_bitstream_amiga(TrackData& trackdata)
{
    auto& bitbuf = trackdata.bitstream();
    bitbuf.seek(0);

    Track track;
    track.tracklen = bitbuf.track_bitsize();

    CRC16 crc;
    uint32_t dword = 0;
    uint32_t sync_mask = opt.a1sync ? 0xffdfffdf : 0xffffffff;

    while (!bitbuf.wrapped())
    {
        // Give up if no headers were found in the first revolution
        if (!track.size() && bitbuf.tell() > track.tracklen)
            break;

        dword = (dword << 1) | bitbuf.read1();

        // Check for A1A1 MFM sync markers
        if ((dword & sync_mask) != 0x44894489)
            continue;

        auto sector_offset = bitbuf.tell();

        // Decode the info block from the odd and even MFM components
        uint32_t info = 0, calcsum = 0;
        if (!amiga_read_dwords(bitbuf, &info, 1, calcsum))
            continue;

        uint8_t type = info & 0xff;
        uint8_t track_nr = (info >> 8) & 0xff;
        uint8_t sector_nr = (info >> 16) & 0xff;
        uint8_t eot = (info >> 24) & 0xff;

        // Check for AmigaDOS (0xff), sector / sector end within normal range, and track number matching physical location
        auto max_sectors{ (bitbuf.datarate == DataRate::_500K) ? 22 : 11 };
        if (type != 0xff || sector_nr >= max_sectors || !eot || eot > max_sectors ||
            track_nr != static_cast<uint8_t>((trackdata.cylhead.cyl << 1) + trackdata.cylhead.head))
            continue;

        std::vector<uint32_t> label(4);
        if (!amiga_read_dwords(bitbuf, label.data(), label.size(), calcsum))
            continue;

        // Warn if the label field isn't empty
        if (*std::max_element(label.begin(), label.end()) != 0)
            Message(msgWarning, "%s label field is not empty", CHS(trackdata.cylhead.cyl, trackdata.cylhead.head, (info >> 8) & 0xff));

        // Read the header checksum, and combine with checksum so far
        uint32_t disksum;
        if (!amiga_read_dwords(bitbuf, &disksum, 1, calcsum))
            continue;

        // Mask the checksum to include only the data bits
        calcsum &= MFM_MASK;
        if (calcsum != 0 && !opt.idcrc)
            continue;

        Sector sector(bitbuf.datarate, Encoding::Amiga, Header(trackdata.cylhead, sector_nr, 2));
        sector.offset = bitbuf.track_offset(sector_offset);

        // Read the data checksum
        if (!amiga_read_dwords(bitbuf, &disksum, 1, calcsum))
            continue;

        // Read the data field
        Data data(sector.size());
        if (!amiga_read_dwords(bitbuf, reinterpret_cast<uint32_t*>(data.data()), data.size() / sizeof(uint32_t), calcsum))
            continue;

        if (opt.debug)
            util::cout << "s_b_amiga (id=" << sector_nr << ") at offset " << sector_offset << " (" << bitbuf.track_offset(sector_offset) << ")\n";

        bool bad_data = (calcsum & MFM_MASK) != 0;
        sector.add(std::move(data), bad_data, 0x00);

        track.add(std::move(sector));
    }

    trackdata.add(std::move(track));
}